

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O1

bool __thiscall QHstsCache::isKnownHost(QHstsCache *this,QUrl *url)

{
  _Base_ptr *this_00;
  int *piVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  CutResult CVar5;
  iterator __position;
  qsizetype qVar6;
  int iVar7;
  long in_FS_OFFSET;
  key_type local_a8;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  QString local_60;
  undefined1 *local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QUrl::isValid();
  bVar3 = true;
  if (cVar2 != '\0') {
    QUrl::host(&local_60,url,0x7f00000);
    bVar3 = is_valid_domain_name(&local_60);
    bVar3 = !bVar3;
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (bVar3) {
    bVar3 = false;
  }
  else {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = 0xaaaaaaaa;
    uStack_74 = 0xaaaaaaaa;
    uStack_70 = 0xaaaaaaaa;
    uStack_6c = 0xaaaaaaaa;
    QUrl::host(&local_78,url,0x7f00000);
    local_a8.name.d.d = (Data *)0x0;
    local_a8.name.d.ptr = (char16_t *)0x0;
    local_a8.fragment.m_data = (storage_type_conflict *)CONCAT44(uStack_6c,uStack_70);
    local_a8.name.d.size = 0;
    local_a8.fragment.m_size = (qsizetype)local_68;
    bVar3 = false;
    do {
      if ((undefined1 *)local_a8.fragment.m_size == (undefined1 *)0x0) goto LAB_00173b6b;
      __position = std::
                   _Rb_tree<QHstsCache::HostName,_std::pair<const_QHstsCache::HostName,_QHstsPolicy>,_std::_Select1st<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
                   ::find((_Rb_tree<QHstsCache::HostName,_std::pair<const_QHstsCache::HostName,_QHstsPolicy>,_std::_Select1st<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
                           *)this,&local_a8);
      if ((_Rb_tree_header *)__position._M_node ==
          &(this->knownHosts)._M_t._M_impl.super__Rb_tree_header) {
LAB_00173ae9:
        qVar6 = QStringView::indexOf(&local_a8.fragment,(QChar)0x2e,0,CaseSensitive);
        if (qVar6 == -1) {
          iVar7 = 3;
        }
        else {
          local_40 = qVar6 + 1;
          local_48 = (undefined1 *)0xffffffffffffffff;
          CVar5 = QtPrivate::QContainerImplHelper::mid
                            (local_a8.fragment.m_size,&local_40,(qsizetype *)&local_48);
          iVar7 = 0;
          if (CVar5 == Null) {
            local_a8.fragment.m_size = 0;
            local_a8.fragment.m_data = (storage_type_conflict *)0x0;
          }
          else {
            local_a8.fragment.m_data = local_a8.fragment.m_data + local_40;
            local_a8.fragment.m_size = (qsizetype)local_48;
          }
          bVar3 = true;
        }
      }
      else {
        this_00 = &__position._M_node[2]._M_parent;
        bVar4 = QHstsPolicy::isExpired((QHstsPolicy *)this_00);
        if (bVar4) {
          std::
          _Rb_tree<QHstsCache::HostName,std::pair<QHstsCache::HostName_const,QHstsPolicy>,std::_Select1st<std::pair<QHstsCache::HostName_const,QHstsPolicy>>,std::less<QHstsCache::HostName>,std::allocator<std::pair<QHstsCache::HostName_const,QHstsPolicy>>>
          ::erase_abi_cxx11_((_Rb_tree<QHstsCache::HostName,std::pair<QHstsCache::HostName_const,QHstsPolicy>,std::_Select1st<std::pair<QHstsCache::HostName_const,QHstsPolicy>>,std::less<QHstsCache::HostName>,std::allocator<std::pair<QHstsCache::HostName_const,QHstsPolicy>>>
                              *)this,__position);
          if (this->hstsStore != (QHstsStore *)0x0) {
            QHstsStore::addToObserved(this->hstsStore,(QHstsPolicy *)this_00);
          }
          goto LAB_00173ae9;
        }
        iVar7 = 1;
        if ((bVar3) && (bVar4 = QHstsPolicy::includesSubDomains((QHstsPolicy *)this_00), !bVar4))
        goto LAB_00173ae9;
      }
    } while (iVar7 == 0);
    if (iVar7 == 3) {
LAB_00173b6b:
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
    if (&(local_a8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_a8.name.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar1 = (int *)CONCAT44(uStack_74,local_78);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QHstsCache::isKnownHost(const QUrl &url) const
{
    if (!url.isValid() || !is_valid_domain_name(url.host()))
        return false;

    /*
        RFC6797, 8.2.  Known HSTS Host Domain Name Matching

        * Superdomain Match
          If a label-for-label match between an entire Known HSTS Host's
          domain name and a right-hand portion of the given domain name
          is found, then this Known HSTS Host's domain name is a
          superdomain match for the given domain name.  There could be
          multiple superdomain matches for a given domain name.
        * Congruent Match
          If a label-for-label match between a Known HSTS Host's domain
          name and the given domain name is found -- i.e., there are no
          further labels to compare -- then the given domain name
          congruently matches this Known HSTS Host.

        We start from the congruent match, and then chop labels and dots and
        proceed with superdomain match. While RFC6797 recommends to start from
        superdomain, the result is the same - some valid policy will make a host
        known.
    */

    bool superDomainMatch = false;
    const QString hostNameAsString(url.host());
    HostName nameToTest(QStringView{hostNameAsString});
    while (nameToTest.fragment.size()) {
        auto const pos = knownHosts.find(nameToTest);
        if (pos != knownHosts.end()) {
            if (pos->second.isExpired()) {
                knownHosts.erase(pos);
#if QT_CONFIG(settings)
                if (hstsStore) {
                    // Inform our store that this policy has expired.
                    hstsStore->addToObserved(pos->second);
                }
#endif // QT_CONFIG(settings)
            } else if (!superDomainMatch || pos->second.includesSubDomains()) {
                return true;
            }
        }

        const qsizetype dot = nameToTest.fragment.indexOf(u'.');
        if (dot == -1)
            break;

        nameToTest.fragment = nameToTest.fragment.mid(dot + 1);
        superDomainMatch = true;
    }

    return false;
}